

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getInputPrimitiveTypeQualifier_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this,
          GLenum gs_input_primitive_type)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)gs_input_primitive_type < 4) {
    if (gs_input_primitive_type == 0) {
      pcVar1 = "points";
    }
    else {
      if (gs_input_primitive_type != 1) {
        return __return_storage_ptr__;
      }
      pcVar1 = "lines";
    }
  }
  else if (gs_input_primitive_type == 4) {
    pcVar1 = "triangles";
  }
  else if (gs_input_primitive_type == 10) {
    pcVar1 = "lines_adjacency";
  }
  else {
    if (gs_input_primitive_type != 0xc) {
      return __return_storage_ptr__;
    }
    pcVar1 = "triangles_adjacency";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getInputPrimitiveTypeQualifier(
	glw::GLenum gs_input_primitive_type) const
{
	std::string result;

	switch (gs_input_primitive_type)
	{
	case GL_POINTS:
		result = "points";
		break;
	case GL_LINES:
		result = "lines";
		break;
	case GL_LINES_ADJACENCY:
		result = "lines_adjacency";
		break;
	case GL_TRIANGLES:
		result = "triangles";
		break;
	case GL_TRIANGLES_ADJACENCY:
		result = "triangles_adjacency";
		break;

	default:
	{
		DE_ASSERT(0);
	}
	} /* switch (gs_input_primitive_type) */

	return result;
}